

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_9703::MemoryMappedFileTest_DtorUnmapsFile_Test::TestBody
          (MemoryMappedFileTest_DtorUnmapsFile_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  size_t size;
  char *message;
  long *plVar5;
  char cVar6;
  DeathTest *pDVar7;
  StringRef data;
  DeathTest *gtest_dt;
  File file;
  string filename;
  MemoryMappedFile<fmt::File> f;
  DeathTest *local_110;
  DeathTest *local_108;
  AssertHelper local_100 [4];
  CStringRef local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  RE local_c0;
  
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_d0 = *plVar5;
    lStack_c8 = plVar4[3];
    local_e0.data_ = (char *)&local_d0;
  }
  else {
    local_d0 = *plVar5;
    local_e0.data_ = (char *)*plVar4;
  }
  local_d8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((regex_t *)local_c0.pattern_ != &local_c0.full_regex_) {
    operator_delete(local_c0.pattern_,(ulong)(local_c0.full_regex_.buffer + 1));
  }
  data.size_ = 3;
  data.data_ = "abc";
  WriteFile(local_e0,data);
  fmt::File::File((File *)local_100,local_e0,0);
  size = fmt::File::size((File *)local_100);
  mp::MemoryMappedFile<fmt::File>::MemoryMappedFile
            ((MemoryMappedFile<fmt::File> *)&local_c0,(File *)local_100,size);
  mp::internal::MemoryMappedFileBase::~MemoryMappedFileBase((MemoryMappedFileBase *)&local_c0);
  fmt::File::~File((File *)local_100);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::RE::Init(&local_c0,"");
    bVar2 = testing::internal::DeathTest::Create
                      ("(void)*start",&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc"
                       ,0x11f,&local_110);
    pDVar7 = local_110;
    if (bVar2) {
      if (local_110 != (DeathTest *)0x0) {
        local_108 = local_110;
        iVar3 = (*local_110->_vptr_DeathTest[2])(local_110);
        pDVar1 = local_110;
        if (iVar3 == 0) {
          iVar3 = (*local_110->_vptr_DeathTest[3])(local_110);
          bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
          iVar3 = (*local_110->_vptr_DeathTest[4])(local_110,(ulong)bVar2);
          cVar6 = (char)iVar3;
        }
        else {
          cVar6 = '\x01';
          if (iVar3 == 1) {
            testing::internal::AlwaysTrue();
            (*local_110->_vptr_DeathTest[5])(local_110,2);
            (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
            pDVar7 = local_108;
            if (local_108 == (DeathTest *)0x0) goto LAB_00111a86;
          }
        }
        bVar2 = testing::internal::IsTrue(true);
        if (bVar2) {
          (*pDVar7->_vptr_DeathTest[1])(pDVar7);
        }
        if (cVar6 == '\0') goto LAB_00111a92;
      }
LAB_00111a86:
      testing::internal::RE::~RE(&local_c0);
      goto LAB_00111b08;
    }
LAB_00111a92:
    testing::internal::RE::~RE(&local_c0);
  }
  testing::Message::Message((Message *)&local_c0);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x11f,
             message);
  testing::internal::AssertHelper::operator=(local_100,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper(local_100);
  if ((((long *)local_c0.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_c0.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_c0.pattern_ + 8))();
  }
LAB_00111b08:
  if ((long *)local_e0.data_ != &local_d0) {
    operator_delete(local_e0.data_,local_d0 + 1);
  }
  return;
}

Assistant:

TEST(MemoryMappedFileTest, DtorUnmapsFile) {
  std::string filename = GetExecutableDir() + "/test";
  WriteFile(filename, "abc");
  const volatile char *start = 0;
  {
    File file(filename, File::RDONLY);
    MemoryMappedFile<> f(file, static_cast<std::size_t>(file.size()));
    start = f.start();
  }
  EXPECT_DEATH((void)*start, "");
}